

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void Curl_ssl_conn_config_update(Curl_easy *data,_Bool for_proxy)

{
  byte bVar1;
  connectdata *pcVar2;
  byte bVar3;
  byte bVar4;
  ssl_config_data *psVar5;
  
  pcVar2 = data->conn;
  if (pcVar2 != (connectdata *)0x0) {
    psVar5 = &(data->set).proxy_ssl;
    if (!for_proxy) {
      psVar5 = &(data->set).ssl;
    }
    bVar3 = (psVar5->primary).field_0x79 & 2;
    bVar1 = (&pcVar2->ssl_config)[for_proxy].field_0x79;
    (&pcVar2->ssl_config)[for_proxy].field_0x79 = bVar1 & 0xfd | bVar3;
    bVar4 = (psVar5->primary).field_0x79 & 1;
    (&pcVar2->ssl_config)[for_proxy].field_0x79 = bVar1 & 0xfc | bVar3 | bVar4;
    (&pcVar2->ssl_config)[for_proxy].field_0x79 =
         bVar1 & 0xf8 | bVar3 | bVar4 | (psVar5->primary).field_0x79 & 4;
  }
  return;
}

Assistant:

void Curl_ssl_conn_config_update(struct Curl_easy *data, bool for_proxy)
{
  /* May be called on an easy that has no connection yet */
  if(data->conn) {
    struct ssl_primary_config *src, *dest;
#ifndef CURL_DISABLE_PROXY
    src = for_proxy? &data->set.proxy_ssl.primary : &data->set.ssl.primary;
    dest = for_proxy? &data->conn->proxy_ssl_config : &data->conn->ssl_config;
#else
    (void)for_proxy;
    src = &data->set.ssl.primary;
    dest = &data->conn->ssl_config;
#endif
    dest->verifyhost = src->verifyhost;
    dest->verifypeer = src->verifypeer;
    dest->verifystatus = src->verifystatus;
  }
}